

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Ssl.cpp
# Opt level: O1

bool __thiscall axl::io::Ssl::create(Ssl *this,SSL_CTX *ctx)

{
  bool bVar1;
  SSL *pSVar2;
  
  pSVar2 = (SSL *)(this->super_Handle<ssl_st_*,_axl::io::FreeSsl,_axl::sl::Zero<ssl_st_*>_>).m_h;
  if (pSVar2 != (SSL *)0x0) {
    SSL_free(pSVar2);
    (this->super_Handle<ssl_st_*,_axl::io::FreeSsl,_axl::sl::Zero<ssl_st_*>_>).m_h = (ssl_st *)0x0;
  }
  pSVar2 = SSL_new((SSL_CTX *)ctx);
  (this->super_Handle<ssl_st_*,_axl::io::FreeSsl,_axl::sl::Zero<ssl_st_*>_>).m_h = (ssl_st *)pSVar2;
  bVar1 = cry::completeWithLastCryptoError<bool>(pSVar2 != (SSL *)0x0,false);
  return bVar1;
}

Assistant:

bool
Ssl::create(SSL_CTX* ctx) {
	close();

	m_h = SSL_new(ctx);
	return cry::completeWithLastCryptoError(m_h != NULL);
}